

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_type_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  Curl_easy *data;
  CURLcode CVar1;
  char *pcVar2;
  size_t length;
  char *pcVar3;
  ftpstate instate_00;
  char *pcVar4;
  char *local_30;
  
  if (99 < ftpcode - 200U) {
    Curl_failf(conn->data,"Couldn\'t set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  if (ftpcode != 200) {
    Curl_infof(conn->data,"Got a %03d response code instead of the assumed 200\n");
  }
  switch(instate) {
  case FTP_TYPE:
    CVar1 = ftp_state_size(conn);
    return CVar1;
  case FTP_LIST_TYPE:
    data = conn->data;
    pcVar4 = (data->state).path;
    local_30 = (char *)0x0;
    if (((pcVar4 != (char *)0x0 && (data->set).ftp_filemethod == FTPFILE_NOCWD) && (*pcVar4 != '\0')
        ) && (pcVar2 = strchr(pcVar4,0x2f), pcVar2 != (char *)0x0)) {
      length = strlen(pcVar4);
      if (pcVar4[length - 1] != '/') {
        pcVar2 = strrchr(pcVar4,0x2f);
        length = (long)pcVar2 - (long)pcVar4;
      }
      CVar1 = Curl_urldecode(data,pcVar4,length,&local_30,(size_t *)0x0,true);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    }
    pcVar4 = (data->set).str[6];
    if ((pcVar4 == (char *)0x0) && (pcVar4 = "LIST", (data->set).ftp_list_only != false)) {
      pcVar4 = "NLST";
    }
    pcVar2 = " ";
    pcVar3 = local_30;
    if (local_30 == (char *)0x0) {
      pcVar2 = "";
      pcVar3 = "";
    }
    pcVar4 = curl_maprintf("%s%s%s",pcVar4,pcVar2,pcVar3);
    if (pcVar4 == (char *)0x0) {
      (*Curl_cfree)(local_30);
      CVar1 = CURLE_OUT_OF_MEMORY;
    }
    else {
      CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",pcVar4);
      (*Curl_cfree)(local_30);
      (*Curl_cfree)(pcVar4);
      if (CVar1 == CURLE_OK) {
        (conn->proto).ftpc.state = FTP_LIST;
        CVar1 = CURLE_OK;
      }
    }
    break;
  case FTP_RETR_TYPE:
    instate_00 = FTP_RETR_PREQUOTE;
    goto LAB_00116609;
  case FTP_STOR_TYPE:
    instate_00 = FTP_STOR_PREQUOTE;
LAB_00116609:
    CVar1 = ftp_state_quote(conn,true,instate_00);
    return CVar1;
  default:
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_state_type_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  if(ftpcode/100 != 2) {
    /* "sasserftpd" and "(u)r(x)bot ftpd" both responds with 226 after a
       successful 'TYPE I'. While that is not as RFC959 says, it is still a
       positive response code and we allow that. */
    failf(data, "Couldn't set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  if(ftpcode != 200)
    infof(data, "Got a %03d response code instead of the assumed 200\n",
          ftpcode);

  if(instate == FTP_TYPE)
    result = ftp_state_size(conn);
  else if(instate == FTP_LIST_TYPE)
    result = ftp_state_list(conn);
  else if(instate == FTP_RETR_TYPE)
    result = ftp_state_retr_prequote(conn);
  else if(instate == FTP_STOR_TYPE)
    result = ftp_state_stor_prequote(conn);

  return result;
}